

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_indirect_sort(uint64_t *freq,uint64_t *syms,uint64_t *a,uint64_t n)

{
  uint64_t *puVar1;
  undefined8 uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  uint64_t *puVar7;
  uint64_t uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t *puVar12;
  uint64_t t_1;
  uint64_t *puVar13;
  
  do {
    puVar1 = a + n;
    puVar4 = a;
    if (n < 7) {
      do {
        puVar4 = puVar4 + 1;
        puVar5 = puVar4;
        if (puVar1 <= puVar4) {
          return;
        }
        for (; a < puVar5; puVar5 = puVar5 + -1) {
          uVar8 = *puVar5;
          if (freq[puVar5[-1]] == freq[uVar8] || (long)(freq[puVar5[-1]] - freq[uVar8]) < 0) break;
          *puVar5 = puVar5[-1];
          puVar5[-1] = uVar8;
        }
      } while( true );
    }
    puVar4 = a + (n >> 1);
    if (n != 7) {
      puVar5 = a + (n - 1);
      puVar3 = a;
      if (0x28 < n) {
        uVar11 = n & 0xfffffffffffffff8;
        puVar3 = shuff_med3(a,(uint64_t *)((long)a + uVar11),a + (n >> 3) * 2,freq);
        puVar4 = shuff_med3((uint64_t *)((long)puVar4 - uVar11),puVar4,
                            (uint64_t *)((long)puVar4 + uVar11),freq);
        puVar5 = shuff_med3(puVar5 + (n >> 3) * -2,(uint64_t *)((long)puVar5 - uVar11),puVar5,freq);
      }
      puVar4 = shuff_med3(puVar3,puVar4,puVar5,freq);
    }
    uVar8 = *a;
    puVar3 = a + (n - 1);
    *a = *puVar4;
    puVar5 = a + 1;
    *puVar4 = uVar8;
    puVar4 = puVar5;
    puVar7 = puVar5;
    puVar13 = puVar3;
LAB_0012d388:
    for (; puVar12 = puVar3, puVar5 <= puVar3; puVar5 = puVar5 + 1) {
      uVar8 = freq[*puVar5];
      uVar6 = freq[*a];
      if (uVar8 != uVar6 && -1 < (long)(uVar8 - uVar6)) break;
      if (uVar8 == uVar6) {
        uVar8 = *puVar7;
        *puVar7 = *puVar5;
        puVar7 = puVar7 + 1;
        *puVar5 = uVar8;
      }
      puVar4 = puVar4 + 1;
    }
    for (; puVar5 <= puVar3; puVar3 = puVar3 + -1) {
      uVar8 = *puVar3;
      if ((long)(freq[uVar8] - freq[*a]) < 0) goto LAB_0012d3f3;
      if (freq[uVar8] == freq[*a]) {
        *puVar3 = *puVar13;
        *puVar13 = uVar8;
        puVar13 = puVar13 + -1;
      }
      puVar12 = puVar12 + -1;
    }
    uVar8 = (long)puVar7 - (long)a >> 3;
    uVar6 = (long)puVar4 - (long)puVar7 >> 3;
    if ((long)uVar6 <= (long)uVar8) {
      uVar8 = uVar6;
    }
    if (0 < (long)uVar8) {
      uVar11 = uVar8 + 1;
      lVar9 = 0;
      do {
        uVar2 = *(undefined8 *)((long)a + lVar9);
        uVar11 = uVar11 - 1;
        *(undefined8 *)((long)a + lVar9) = *(undefined8 *)((long)puVar5 + lVar9 + uVar8 * -8);
        *(undefined8 *)((long)puVar5 + lVar9 + uVar8 * -8) = uVar2;
        lVar9 = lVar9 + 8;
      } while (1 < uVar11);
    }
    n = (long)puVar13 - (long)puVar12 >> 3;
    uVar11 = ((long)puVar1 - (long)puVar13 >> 3) - 1;
    if ((long)n < (long)uVar11) {
      uVar11 = n;
    }
    if (0 < (long)uVar11) {
      uVar10 = uVar11 + 1;
      lVar9 = 0;
      do {
        uVar2 = *(undefined8 *)((long)puVar5 + lVar9);
        uVar10 = uVar10 - 1;
        *(undefined8 *)((long)puVar5 + lVar9) = *(undefined8 *)((long)puVar1 + lVar9 + uVar11 * -8);
        *(undefined8 *)((long)puVar1 + lVar9 + uVar11 * -8) = uVar2;
        lVar9 = lVar9 + 8;
      } while (1 < uVar10);
    }
    if (1 < (long)uVar6) {
      shuff_indirect_sort(freq,syms,a,uVar6);
    }
    if ((long)n < 2) {
      return;
    }
    a = puVar1 + -n;
  } while( true );
LAB_0012d3f3:
  uVar6 = *puVar5;
  *puVar5 = uVar8;
  puVar5 = puVar5 + 1;
  *puVar3 = uVar6;
  puVar3 = puVar3 + -1;
  puVar4 = puVar5;
  goto LAB_0012d388;
}

Assistant:

void shuff_indirect_sort(
    uint64_t* freq, uint64_t* syms, uint64_t* a, uint64_t n)
{
    uint64_t *pa, *pb, *pc, *pd, *pl, *pm, *pn;
    int64_t d, r;
    const int64_t es = 1;

    if (n < 7) {
        for (pm = a + es; pm < a + n * es; pm += es)
            for (pl = pm; pl > a && shuff_cmp(pl - es, pl, freq) > 0; pl -= es)
                shuff_swap(pl, pl - es);
        return;
    }
    pm = a + (n / 2) * es;
    if (n > 7) {
        pl = a;
        pn = a + (n - 1) * es;
        if (n > 40) {
            d = (n / 8) * es;
            pl = shuff_med3(pl, pl + d, pl + 2 * d, freq);
            pm = shuff_med3(pm - d, pm, pm + d, freq);
            pn = shuff_med3(pn - 2 * d, pn - d, pn, freq);
        }
        pm = shuff_med3(pl, pm, pn, freq);
    }
    shuff_swap(a, pm);
    pa = pb = a + es;

    pc = pd = a + (n - 1) * es;
    for (;;) {
        while (pb <= pc && (r = shuff_cmp(pb, a, freq)) <= 0) {
            if (r == 0) {
                shuff_swap(pa, pb);
                pa += es;
            }
            pb += es;
        }
        while (pb <= pc && (r = shuff_cmp(pc, a, freq)) >= 0) {
            if (r == 0) {
                shuff_swap(pc, pd);
                pd -= es;
            }
            pc -= es;
        }
        if (pb > pc)
            break;
        shuff_swap(pb, pc);
        pb += es;
        pc -= es;
    }
    pn = a + n * es;
    r = shuff_min(pa - a, pb - pa);
    vecshuff_swap(a, pb - r, r);
    r = shuff_min(pd - pc, pn - pd - es);
    vecshuff_swap(pb, pn - r, r);
    if ((r = pb - pa) > es)
        shuff_indirect_sort(freq, syms, a, r / es);
    if ((r = pd - pc) > es)
        shuff_indirect_sort(freq, syms, pn - r, r / es);
}